

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.cpp
# Opt level: O0

void print_total_size(void)

{
  bool bVar1;
  int iVar2;
  log_level lVar3;
  Mempool *this;
  Logger *pLVar4;
  int total_size;
  
  this = Mempool::get_instance();
  iVar2 = Mempool::get_total_size_kb(this);
  pLVar4 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar4);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","print_total_size",0xd);
  }
  lVar3 = Logger::get_log_level();
  if (1 < (int)lVar3) {
    pLVar4 = Logger::get_instance();
    Logger::write_log(pLVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"print_total_size",0xd,LOG_LEVEL_INFO,"total size of mem pool is %dkb\n",
                      iVar2);
    pLVar4 = Logger::get_instance();
    Logger::flush(pLVar4);
  }
  return;
}

Assistant:

void print_total_size()
{
    int total_size = Mempool::get_instance().get_total_size_kb();
    LOG_INFO("total size of mem pool is %dkb\n", total_size);
}